

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

void SkipLine(ConfigScanner *sc)

{
  char firstbyte;
  size_t sVar1;
  char *pcVar2;
  long lStack_20;
  
  if (sc != (ConfigScanner *)0x0) {
    pcVar2 = sc->ptr;
    while( true ) {
      firstbyte = *pcVar2;
      sVar1 = GetUTF8Length(firstbyte);
      if (firstbyte == '\0') break;
      if (firstbyte == '\n') {
        lStack_20 = 1;
LAB_0014c6fd:
        sc->ptr = pcVar2 + lStack_20;
        return;
      }
      if (firstbyte == '\r') {
        sc->ptr = pcVar2 + 1;
        if (pcVar2[1] != '\n') {
          return;
        }
        lStack_20 = 2;
        goto LAB_0014c6fd;
      }
      if (sVar1 == 0) {
        return;
      }
      pcVar2 = pcVar2 + sVar1;
      sc->ptr = pcVar2;
    }
  }
  return;
}

Assistant:

void SkipLine(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return;
	}
	while (true)
	{
		size_t step = GetUTF8Length(*sc->ptr);
		switch (*sc->ptr)
		{
		case '\0':
			return;
		case '\n':
			sc->ptr++;
			return;
		case '\r':
			sc->ptr++;
			if (*sc->ptr == '\n')
			{
				sc->ptr++;
			}
			return;
		default:
			if (step == 0)
			{
				return;
			}
			sc->ptr += step;
		}
	}
	return;
}